

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upgrade_memory_model.cpp
# Opt level: O1

uint64_t __thiscall
spvtools::opt::UpgradeMemoryModel::GetIndexValue(UpgradeMemoryModel *this,Instruction *index_inst)

{
  char cVar1;
  IRContext *this_00;
  int iVar2;
  int32_t iVar3;
  uint32_t uVar4;
  Constant *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar5;
  
  this_00 = (this->super_Pass).context_;
  if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
    IRContext::BuildConstantManager(this_00);
  }
  this_01 = analysis::ConstantManager::GetConstantFromInst
                      ((this_00->constant_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
                       _M_head_impl,index_inst);
  iVar2 = (*this_01->_vptr_Constant[0xe])(this_01);
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*this_01->type_->_vptr_Type[10])();
    cVar1 = *(char *)(CONCAT44(extraout_var_00,iVar2) + 0x28);
    iVar2 = (*this_01->type_->_vptr_Type[10])();
    iVar2 = *(int *)(CONCAT44(extraout_var_01,iVar2) + 0x24);
    if (cVar1 == '\x01') {
      if (iVar2 != 0x20) {
        uVar5 = analysis::Constant::GetS64(this_01);
        return uVar5;
      }
      iVar3 = analysis::Constant::GetS32(this_01);
      uVar5 = (uint64_t)iVar3;
    }
    else {
      if (iVar2 != 0x20) {
        uVar5 = analysis::Constant::GetU64(this_01);
        return uVar5;
      }
      uVar4 = analysis::Constant::GetU32(this_01);
      uVar5 = (uint64_t)uVar4;
    }
    return uVar5;
  }
  __assert_fail("index_constant->AsIntConstant()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/upgrade_memory_model.cpp"
                ,0x1ee,"uint64_t spvtools::opt::UpgradeMemoryModel::GetIndexValue(Instruction *)");
}

Assistant:

uint64_t UpgradeMemoryModel::GetIndexValue(Instruction* index_inst) {
  const analysis::Constant* index_constant =
      context()->get_constant_mgr()->GetConstantFromInst(index_inst);
  assert(index_constant->AsIntConstant());
  if (index_constant->type()->AsInteger()->IsSigned()) {
    if (index_constant->type()->AsInteger()->width() == 32) {
      return index_constant->GetS32();
    } else {
      return index_constant->GetS64();
    }
  } else {
    if (index_constant->type()->AsInteger()->width() == 32) {
      return index_constant->GetU32();
    } else {
      return index_constant->GetU64();
    }
  }
}